

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_sign.cc
# Opt level: O0

int ASN1_item_sign_ctx(ASN1_ITEM *it,X509_ALGOR *algor1,X509_ALGOR *algor2,
                      ASN1_BIT_STRING *signature,void *asn,EVP_MD_CTX *ctx)

{
  int iVar1;
  ulong local_68;
  size_t out_len;
  EVP_PKEY *pkey;
  uint8_t *puStack_50;
  int in_len;
  uint8_t *out;
  uint8_t *in;
  EVP_MD_CTX *pEStack_38;
  int ret;
  EVP_MD_CTX *ctx_local;
  void *asn_local;
  ASN1_BIT_STRING *signature_local;
  X509_ALGOR *algor2_local;
  X509_ALGOR *algor1_local;
  ASN1_ITEM *it_local;
  
  in._4_4_ = 0;
  out = (uint8_t *)0x0;
  puStack_50 = (uint8_t *)0x0;
  pEStack_38 = ctx;
  ctx_local = (EVP_MD_CTX *)asn;
  asn_local = signature;
  signature_local = (ASN1_BIT_STRING *)algor2;
  algor2_local = (X509_ALGOR *)algor1;
  algor1_local = (X509_ALGOR *)it;
  if (signature->type == 3) {
    if ((((algor1 == (X509_ALGOR *)0x0) ||
         (iVar1 = x509_digest_sign_algorithm((EVP_MD_CTX *)ctx,(X509_ALGOR *)algor1), iVar1 != 0))
        && ((signature_local == (ASN1_BIT_STRING *)0x0 ||
            (iVar1 = x509_digest_sign_algorithm
                               ((EVP_MD_CTX *)pEStack_38,(X509_ALGOR *)signature_local), iVar1 != 0)
            ))) &&
       (pkey._4_4_ = ASN1_item_i2d((ASN1_VALUE *)ctx_local,&out,(ASN1_ITEM *)algor1_local),
       -1 < pkey._4_4_)) {
      out_len = (size_t)EVP_PKEY_CTX_get0_pkey((EVP_PKEY_CTX *)pEStack_38->flags);
      iVar1 = EVP_PKEY_size((EVP_PKEY *)out_len);
      local_68 = (ulong)iVar1;
      if (local_68 < 0x80000000) {
        puStack_50 = (uint8_t *)OPENSSL_malloc(local_68);
        if (puStack_50 != (uint8_t *)0x0) {
          iVar1 = EVP_DigestSign((EVP_MD_CTX *)pEStack_38,puStack_50,&local_68,out,(long)pkey._4_4_)
          ;
          if (iVar1 == 0) {
            ERR_put_error(0xb,0,6,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/a_sign.cc"
                          ,0x4f);
          }
          else {
            ASN1_STRING_set0((ASN1_STRING *)asn_local,puStack_50,(int)local_68);
            puStack_50 = (uint8_t *)0x0;
            *(ulong *)((long)asn_local + 0x10) =
                 *(ulong *)((long)asn_local + 0x10) & 0xfffffffffffffff0;
            *(ulong *)((long)asn_local + 0x10) = *(ulong *)((long)asn_local + 0x10) | 8;
            in._4_4_ = (int)local_68;
          }
        }
      }
      else {
        ERR_put_error(0xb,0,0x45,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/a_sign.cc"
                      ,0x45);
      }
    }
  }
  else {
    ERR_put_error(0xc,0,0xbf,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/a_sign.cc"
                  ,0x31);
  }
  EVP_MD_CTX_cleanup(pEStack_38);
  OPENSSL_free(out);
  OPENSSL_free(puStack_50);
  return in._4_4_;
}

Assistant:

int ASN1_item_sign_ctx(const ASN1_ITEM *it, X509_ALGOR *algor1,
                       X509_ALGOR *algor2, ASN1_BIT_STRING *signature,
                       void *asn, EVP_MD_CTX *ctx) {
  int ret = 0;
  uint8_t *in = NULL, *out = NULL;

  {
    if (signature->type != V_ASN1_BIT_STRING) {
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_WRONG_TYPE);
      goto err;
    }

    // Write out the requested copies of the AlgorithmIdentifier.
    if (algor1 && !x509_digest_sign_algorithm(ctx, algor1)) {
      goto err;
    }
    if (algor2 && !x509_digest_sign_algorithm(ctx, algor2)) {
      goto err;
    }

    int in_len = ASN1_item_i2d(reinterpret_cast<ASN1_VALUE *>(asn), &in, it);
    if (in_len < 0) {
      goto err;
    }

    EVP_PKEY *pkey = EVP_PKEY_CTX_get0_pkey(ctx->pctx);
    size_t out_len = EVP_PKEY_size(pkey);
    if (out_len > INT_MAX) {
      OPENSSL_PUT_ERROR(X509, ERR_R_OVERFLOW);
      goto err;
    }

    out = reinterpret_cast<uint8_t *>(OPENSSL_malloc(out_len));
    if (out == NULL) {
      goto err;
    }

    if (!EVP_DigestSign(ctx, out, &out_len, in, in_len)) {
      OPENSSL_PUT_ERROR(X509, ERR_R_EVP_LIB);
      goto err;
    }

    ASN1_STRING_set0(signature, out, (int)out_len);
    out = NULL;
    signature->flags &= ~(ASN1_STRING_FLAG_BITS_LEFT | 0x07);
    signature->flags |= ASN1_STRING_FLAG_BITS_LEFT;
    ret = (int)out_len;
  }

err:
  EVP_MD_CTX_cleanup(ctx);
  OPENSSL_free(in);
  OPENSSL_free(out);
  return ret;
}